

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

int4 __thiscall
ParamListStandard::characterizeAsParam(ParamListStandard *this,Address *loc,int4 size)

{
  PartIterator PVar1;
  bool bVar2;
  int4 iVar3;
  AddrSpace *this_00;
  size_type sVar4;
  const_reference pprVar5;
  uintb uVar6;
  ParamEntryRange *pPVar7;
  ParamEntry *this_01;
  bool local_91;
  ParamEntry *testEntry_1;
  const_iterator local_68;
  ParamEntry *local_60;
  ParamEntry *testEntry;
  undefined1 auStack_50 [4];
  int4 res;
  undefined1 local_40 [8];
  pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator> iterpair;
  ParamEntryResolver *resolver;
  int4 index;
  int4 size_local;
  Address *loc_local;
  ParamListStandard *this_local;
  
  this_00 = Address::getSpace(loc);
  iVar3 = AddrSpace::getIndex(this_00);
  sVar4 = std::vector<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>::
          size(&this->resolverMap);
  if ((ulong)(long)iVar3 < sVar4) {
    pprVar5 = std::vector<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>
              ::operator[](&this->resolverMap,(long)iVar3);
    iterpair.second.iter._M_node = (const_iterator)*pprVar5;
    if (iterpair.second.iter._M_node == (_Base_ptr)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      std::pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator>::
      pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator,_true>
                ((pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator>
                  *)local_40);
      PVar1.iter._M_node = iterpair.second.iter._M_node;
      uVar6 = Address::getOffset(loc);
      _auStack_50 = rangemap<ParamEntryRange>::find
                              ((rangemap<ParamEntryRange> *)PVar1.iter._M_node,uVar6);
      std::pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator>::
      operator=((pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator>
                 *)local_40,(type)auStack_50);
      testEntry._4_4_ = 0;
      while (bVar2 = rangemap<ParamEntryRange>::PartIterator::operator!=
                               ((PartIterator *)local_40,&iterpair.first), bVar2) {
        pPVar7 = rangemap<ParamEntryRange>::PartIterator::operator*((PartIterator *)local_40);
        local_60 = ParamEntryRange::getParamEntry(pPVar7);
        iVar3 = ParamEntry::getMinSize(local_60);
        if ((iVar3 <= size) && (iVar3 = ParamEntry::justifiedContain(local_60,loc,size), iVar3 == 0)
           ) {
          return 1;
        }
        bVar2 = ParamEntry::containedBy(local_60,loc,size);
        if (bVar2) {
          testEntry._4_4_ = 2;
        }
        rangemap<ParamEntryRange>::PartIterator::operator++((PartIterator *)local_40);
      }
      local_91 = false;
      if (testEntry._4_4_ != 2) {
        local_68._M_node = (_Base_ptr)rangemap<ParamEntryRange>::end(iterpair.second.iter._M_node);
        local_91 = rangemap<ParamEntryRange>::PartIterator::operator!=
                             ((PartIterator *)local_40,(PartIterator *)&local_68);
      }
      PVar1.iter._M_node = iterpair.second.iter._M_node;
      if (local_91 != false) {
        uVar6 = Address::getOffset(loc);
        testEntry_1 = (ParamEntry *)
                      rangemap<ParamEntryRange>::find_end
                                ((rangemap<ParamEntryRange> *)PVar1.iter._M_node,
                                 uVar6 + (long)(size + -1));
        rangemap<ParamEntryRange>::PartIterator::operator=
                  (&iterpair.first,(PartIterator *)&testEntry_1);
        while (bVar2 = rangemap<ParamEntryRange>::PartIterator::operator!=
                                 ((PartIterator *)local_40,&iterpair.first), bVar2) {
          pPVar7 = rangemap<ParamEntryRange>::PartIterator::operator*((PartIterator *)local_40);
          this_01 = ParamEntryRange::getParamEntry(pPVar7);
          bVar2 = ParamEntry::containedBy(this_01,loc,size);
          if (bVar2) {
            testEntry._4_4_ = 2;
            break;
          }
          rangemap<ParamEntryRange>::PartIterator::operator++((PartIterator *)local_40);
        }
      }
      this_local._4_4_ = testEntry._4_4_;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int4 ParamListStandard::characterizeAsParam(const Address &loc,int4 size) const

{
  int4 index = loc.getSpace()->getIndex();
  if (index >= resolverMap.size())
    return 0;
  ParamEntryResolver *resolver = resolverMap[index];
  if (resolver == (ParamEntryResolver *)0)
    return 0;
  pair<ParamEntryResolver::const_iterator,ParamEntryResolver::const_iterator> iterpair;
  iterpair = resolver->find(loc.getOffset());
  int4 res = 0;
  while(iterpair.first != iterpair.second) {
    const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
    if (testEntry->getMinSize() <= size && testEntry->justifiedContain(loc, size)==0)
      return 1;
    if (testEntry->containedBy(loc, size))
      res = 2;
    ++iterpair.first;
  }
  if (res != 2 && iterpair.first != resolver->end()) {
    iterpair.second = resolver->find_end(loc.getOffset() + (size-1));
    while(iterpair.first != iterpair.second) {
      const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
      if (testEntry->containedBy(loc, size)) {
	res = 2;
	break;
      }
      ++iterpair.first;
    }
  }
  return res;
}